

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Module * sqlite3PragmaVtabRegister(sqlite3 *db,char *zName)

{
  PragmaName *pAux;
  PragmaName *pName;
  char *zName_local;
  sqlite3 *db_local;
  
  pAux = pragmaLocate(zName + 7);
  if (pAux == (PragmaName *)0x0) {
    db_local = (sqlite3 *)0x0;
  }
  else if ((pAux->mPragFlg & 0x30) == 0) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    db_local = (sqlite3 *)
               sqlite3VtabCreateModule(db,zName,&pragmaVtabModule,pAux,(_func_void_void_ptr *)0x0);
  }
  return (Module *)db_local;
}

Assistant:

SQLITE_PRIVATE Module *sqlite3PragmaVtabRegister(sqlite3 *db, const char *zName){
  const PragmaName *pName;
  assert( sqlite3_strnicmp(zName, "pragma_", 7)==0 );
  pName = pragmaLocate(zName+7);
  if( pName==0 ) return 0;
  if( (pName->mPragFlg & (PragFlg_Result0|PragFlg_Result1))==0 ) return 0;
  assert( sqlite3HashFind(&db->aModule, zName)==0 );
  return sqlite3VtabCreateModule(db, zName, &pragmaVtabModule, (void*)pName, 0);
}